

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int read_metadata(MMDB_s *mmdb)

{
  uint16_t uVar1;
  undefined1 auStack_b0 [4];
  int status;
  MMDB_entry_s metadata_start;
  MMDB_s metadata_db;
  MMDB_s *mmdb_local;
  
  make_fake_metadata_db((MMDB_s *)&metadata_start.offset,mmdb);
  _auStack_b0 = (MMDB_s *)&metadata_start.offset;
  metadata_start.mmdb._0_4_ = 0;
  mmdb_local._4_4_ =
       value_for_key_as_uint32((MMDB_entry_s *)auStack_b0,"node_count",&(mmdb->metadata).node_count)
  ;
  if (mmdb_local._4_4_ == 0) {
    if ((mmdb->metadata).node_count == 0) {
      mmdb_local._4_4_ = 3;
    }
    else {
      mmdb_local._4_4_ =
           value_for_key_as_uint16
                     ((MMDB_entry_s *)auStack_b0,"record_size",&(mmdb->metadata).record_size);
      if (mmdb_local._4_4_ == 0) {
        if ((mmdb->metadata).record_size == 0) {
          mmdb_local._4_4_ = 3;
        }
        else if ((((mmdb->metadata).record_size == 0x18) || ((mmdb->metadata).record_size == 0x1c))
                || ((mmdb->metadata).record_size == 0x20)) {
          mmdb_local._4_4_ =
               value_for_key_as_uint16
                         ((MMDB_entry_s *)auStack_b0,"ip_version",&(mmdb->metadata).ip_version);
          if (mmdb_local._4_4_ == 0) {
            if ((mmdb->metadata).ip_version == 0) {
              mmdb_local._4_4_ = 3;
            }
            else if (((mmdb->metadata).ip_version == 4) || ((mmdb->metadata).ip_version == 6)) {
              mmdb_local._4_4_ =
                   value_for_key_as_string
                             ((MMDB_entry_s *)auStack_b0,"database_type",
                              &(mmdb->metadata).database_type);
              if ((mmdb_local._4_4_ == 0) &&
                 ((mmdb_local._4_4_ =
                        populate_languages_metadata
                                  (mmdb,(MMDB_s *)&metadata_start.offset,(MMDB_entry_s *)auStack_b0)
                  , mmdb_local._4_4_ == 0 &&
                  (mmdb_local._4_4_ =
                        value_for_key_as_uint16
                                  ((MMDB_entry_s *)auStack_b0,"binary_format_major_version",
                                   &(mmdb->metadata).binary_format_major_version),
                  mmdb_local._4_4_ == 0)))) {
                if ((mmdb->metadata).binary_format_major_version == 0) {
                  mmdb_local._4_4_ = 3;
                }
                else {
                  mmdb_local._4_4_ =
                       value_for_key_as_uint16
                                 ((MMDB_entry_s *)auStack_b0,"binary_format_minor_version",
                                  &(mmdb->metadata).binary_format_minor_version);
                  if ((mmdb_local._4_4_ == 0) &&
                     (mmdb_local._4_4_ =
                           value_for_key_as_uint64
                                     ((MMDB_entry_s *)auStack_b0,"build_epoch",
                                      &(mmdb->metadata).build_epoch), mmdb_local._4_4_ == 0)) {
                    if ((mmdb->metadata).build_epoch == 0) {
                      mmdb_local._4_4_ = 3;
                    }
                    else {
                      mmdb_local._4_4_ =
                           populate_description_metadata
                                     (mmdb,(MMDB_s *)&metadata_start.offset,
                                      (MMDB_entry_s *)auStack_b0);
                      if (mmdb_local._4_4_ == 0) {
                        mmdb->full_record_byte_size =
                             (uint16_t)(((ulong)(mmdb->metadata).record_size << 1) >> 3);
                        uVar1 = 0x80;
                        if ((mmdb->metadata).ip_version == 4) {
                          uVar1 = 0x20;
                        }
                        mmdb->depth = uVar1;
                        mmdb_local._4_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
            else {
              mmdb_local._4_4_ = 3;
            }
          }
        }
        else {
          mmdb_local._4_4_ = 6;
        }
      }
    }
  }
  return mmdb_local._4_4_;
}

Assistant:

static int read_metadata(MMDB_s *mmdb) {
    /* We need to create a fake MMDB_s struct in order to decode values from
       the metadata. The metadata is basically just like the data section, so we
       want to use the same functions we use for the data section to get
       metadata values. */
    MMDB_s metadata_db = make_fake_metadata_db(mmdb);

    MMDB_entry_s metadata_start = {.mmdb = &metadata_db, .offset = 0};

    int status = value_for_key_as_uint32(
        &metadata_start, "node_count", &mmdb->metadata.node_count);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (!mmdb->metadata.node_count) {
        DEBUG_MSG("could not find node_count value in metadata");
        return MMDB_INVALID_METADATA_ERROR;
    }

    status = value_for_key_as_uint16(
        &metadata_start, "record_size", &mmdb->metadata.record_size);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (!mmdb->metadata.record_size) {
        DEBUG_MSG("could not find record_size value in metadata");
        return MMDB_INVALID_METADATA_ERROR;
    }

    if (mmdb->metadata.record_size != 24 && mmdb->metadata.record_size != 28 &&
        mmdb->metadata.record_size != 32) {
        DEBUG_MSGF("bad record size in metadata: %i",
                   mmdb->metadata.record_size);
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    status = value_for_key_as_uint16(
        &metadata_start, "ip_version", &mmdb->metadata.ip_version);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (!mmdb->metadata.ip_version) {
        DEBUG_MSG("could not find ip_version value in metadata");
        return MMDB_INVALID_METADATA_ERROR;
    }
    if (!(mmdb->metadata.ip_version == 4 || mmdb->metadata.ip_version == 6)) {
        DEBUG_MSGF("ip_version value in metadata is not 4 or 6 - it was %i",
                   mmdb->metadata.ip_version);
        return MMDB_INVALID_METADATA_ERROR;
    }

    status = value_for_key_as_string(
        &metadata_start, "database_type", &mmdb->metadata.database_type);
    if (MMDB_SUCCESS != status) {
        DEBUG_MSG("error finding database_type value in metadata");
        return status;
    }

    status = populate_languages_metadata(mmdb, &metadata_db, &metadata_start);
    if (MMDB_SUCCESS != status) {
        DEBUG_MSG("could not populate languages from metadata");
        return status;
    }

    status =
        value_for_key_as_uint16(&metadata_start,
                                "binary_format_major_version",
                                &mmdb->metadata.binary_format_major_version);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (!mmdb->metadata.binary_format_major_version) {
        DEBUG_MSG(
            "could not find binary_format_major_version value in metadata");
        return MMDB_INVALID_METADATA_ERROR;
    }

    status =
        value_for_key_as_uint16(&metadata_start,
                                "binary_format_minor_version",
                                &mmdb->metadata.binary_format_minor_version);
    if (MMDB_SUCCESS != status) {
        return status;
    }

    status = value_for_key_as_uint64(
        &metadata_start, "build_epoch", &mmdb->metadata.build_epoch);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (!mmdb->metadata.build_epoch) {
        DEBUG_MSG("could not find build_epoch value in metadata");
        return MMDB_INVALID_METADATA_ERROR;
    }

    status = populate_description_metadata(mmdb, &metadata_db, &metadata_start);
    if (MMDB_SUCCESS != status) {
        DEBUG_MSG("could not populate description from metadata");
        return status;
    }

    mmdb->full_record_byte_size = mmdb->metadata.record_size * 2 / 8U;

    mmdb->depth = mmdb->metadata.ip_version == 4 ? 32 : 128;

    return MMDB_SUCCESS;
}